

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O0

void __thiscall
helics::inproc::InprocComms::loadNetworkInfo(InprocComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  CommsInterface *unaff_retaddr;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  CommsInterface::loadNetworkInfo(unaff_retaddr,(NetworkBrokerData *)in_RDI);
  bVar1 = CommsInterface::propertyLock(this_00);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46cc90);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    CommsInterface::propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void InprocComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
    {
        CommsInterface::loadNetworkInfo(netInfo);
        if (!propertyLock()) {
            return;
        }
        // brokerPort = netInfo.brokerPort;
        // PortNumber = netInfo.portNumber;
        if (localTargetAddress.empty()) {
            localTargetAddress = name;
        }

        // if (PortNumber > 0)
        //{
        //    autoPortNumber = false;
        //}
        propertyUnLock();
    }